

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

SyntaxList<slang::syntax::RandCaseItemSyntax> *
slang::syntax::deepClone<slang::syntax::RandCaseItemSyntax>
          (SyntaxList<slang::syntax::RandCaseItemSyntax> *node,BumpAllocator *alloc)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined4 extraout_var;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *pSVar4;
  EVP_PKEY_CTX *src;
  span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *args;
  EVP_PKEY_CTX *in_RSI;
  undefined8 in_RDI;
  RandCaseItemSyntax **t;
  iterator __end0;
  iterator __begin0;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *__range2;
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> buffer;
  span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffff38;
  RandCaseItemSyntax *in_stack_ffffffffffffff40;
  span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffff48;
  __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
  local_68;
  undefined8 local_60;
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> local_50;
  EVP_PKEY_CTX *local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar3 = std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::size
                    ((span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *)0xa81418);
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL>::SmallVector(&local_50,sVar3);
  local_60 = local_8;
  local_68._M_current =
       (RandCaseItemSyntax **)
       std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff38);
  std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::end
            (in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator*(&local_68);
    deepClone<slang::syntax::RandCaseItemSyntax>
              (in_stack_ffffffffffffff40,(BumpAllocator *)in_stack_ffffffffffffff38);
    SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::RandCaseItemSyntax_*> *)in_stack_ffffffffffffff40,
               (RandCaseItemSyntax **)in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_68);
  }
  iVar2 = SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::copy
                    (&local_50.super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>,local_10,
                     src);
  pSVar4 = BumpAllocator::
           emplace<slang::syntax::SyntaxList<slang::syntax::RandCaseItemSyntax>,std::span<slang::syntax::RandCaseItemSyntax*,18446744073709551615ul>>
                     ((BumpAllocator *)CONCAT44(extraout_var,iVar2),args);
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> *)0xa81533);
  return pSVar4;
}

Assistant:

SyntaxList<T>* deepClone(const SyntaxList<T>& node, BumpAllocator& alloc) {
    SmallVector<T*> buffer(node.size(), UninitializedTag());
    for (auto& t : node)
        buffer.push_back(deepClone(*t, alloc));

    return alloc.emplace<SyntaxList<T>>(buffer.copy(alloc));
}